

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O1

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::VerifyMark
          (HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_> *this)

{
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::VerifyMark()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_1_>
            (this->fullBlockList,0);
  HeapBlockList::
  ForEach<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>,Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>>::VerifyMark()::_lambda(Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>*)_2_>
            (this->heapBlockList,0);
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::VerifyMark()
{
    HeapBlockList::ForEach(this->fullBlockList, [](TBlockType * heapBlock)
    {
        heapBlock->VerifyMark();
    });

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
    if (CONFIG_FLAG_RELEASE(EnableConcurrentSweepAlloc) && !this->IsAnyFinalizableBucket())
    {
        HeapBlockList::ForEach(this->sweepableHeapBlockList, [](TBlockType * heapBlock)
        {
            heapBlock->VerifyMark();
        });
    }
#endif

    HeapBlockList::ForEach(this->heapBlockList, [](TBlockType * heapBlock)
    {
        heapBlock->VerifyMark();
    });
}